

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lu_initialize.c
# Opt level: O0

void lu_initialize(lu_int m,lu_int *istore,double *xstore)

{
  double *in_RDX;
  lu_int *in_RSI;
  int in_EDI;
  lu this;
  lu_int *in_stack_fffffffffffffd30;
  double *in_stack_fffffffffffffd38;
  lu_int *in_stack_fffffffffffffd40;
  double *in_stack_fffffffffffffd48;
  lu_int *in_stack_fffffffffffffd50;
  lu *in_stack_fffffffffffffd58;
  double *in_stack_fffffffffffffd70;
  lu_int *in_stack_fffffffffffffd78;
  double *in_stack_fffffffffffffd80;
  
  *in_RSI = 0x762672;
  *in_RDX = 7743090.0;
  in_RDX[0x40] = (double)in_EDI;
  in_RDX[1] = 0.0;
  in_RDX[2] = 0.0;
  in_RDX[3] = 0.0;
  in_RDX[4] = 1e-20;
  in_RDX[5] = 1e-14;
  in_RDX[6] = 0.1;
  in_RDX[7] = 1.0;
  in_RDX[8] = 3.0;
  in_RDX[9] = 4.0;
  in_RDX[10] = 0.3;
  in_RDX[0xb] = 0.5;
  in_RDX[0xc] = 0.05;
  in_RDX[0xd] = 0.0;
  in_RDX[0xe] = 1.0;
  in_RDX[0x48] = 0.0;
  in_RDX[0x49] = 0.0;
  in_RDX[0x4a] = 0.0;
  in_RDX[0x4b] = 0.0;
  in_RDX[0x55] = 0.0;
  in_RDX[0x56] = 0.0;
  in_RDX[0x57] = 0.0;
  lu_load(in_stack_fffffffffffffd58,in_stack_fffffffffffffd50,in_stack_fffffffffffffd48,
          in_stack_fffffffffffffd40,in_stack_fffffffffffffd38,in_stack_fffffffffffffd30,
          in_stack_fffffffffffffd70,in_stack_fffffffffffffd78,in_stack_fffffffffffffd80);
  lu_reset((lu *)0x85ed29);
  lu_save(&stack0xfffffffffffffd30,in_RSI,in_RDX,0);
  return;
}

Assistant:

void lu_initialize(lu_int m, lu_int *istore, double *xstore)
{
    struct lu this;

    /* set constant entries */
    istore[0]                               = BASICLU_HASH;
    xstore[0]                               = BASICLU_HASH;
    xstore[BASICLU_DIM]                     = m;

    /* set default parameters */
    xstore[BASICLU_MEMORYL]                 = 0;
    xstore[BASICLU_MEMORYU]                 = 0;
    xstore[BASICLU_MEMORYW]                 = 0;
    xstore[BASICLU_DROP_TOLERANCE]          = 1e-20;
    xstore[BASICLU_ABS_PIVOT_TOLERANCE]     = 1e-14;
    xstore[BASICLU_REL_PIVOT_TOLERANCE]     = 0.1;
    xstore[BASICLU_BIAS_NONZEROS]           = 1;
    xstore[BASICLU_MAXN_SEARCH_PIVOT]       = 3;
    xstore[BASICLU_PAD]                     = 4;
    xstore[BASICLU_STRETCH]                 = 0.3;
    xstore[BASICLU_COMPRESSION_THRESHOLD]   = 0.5;
    xstore[BASICLU_SPARSE_THRESHOLD]        = 0.05;
    xstore[BASICLU_REMOVE_COLUMNS]          = 0;
    xstore[BASICLU_SEARCH_ROWS]             = 1;

    /* initialize global counters */
    xstore[BASICLU_NFACTORIZE]              = 0;
    xstore[BASICLU_NUPDATE_TOTAL]           = 0;
    xstore[BASICLU_NFORREST_TOTAL]          = 0;
    xstore[BASICLU_NSYMPERM_TOTAL]          = 0;
    xstore[BASICLU_TIME_FACTORIZE_TOTAL]    = 0;
    xstore[BASICLU_TIME_SOLVE_TOTAL]        = 0;
    xstore[BASICLU_TIME_UPDATE_TOTAL]       = 0;

    /* lu_reset() and lu_save() initializes the remaining slots */
    lu_load(&this, istore, xstore, NULL, NULL, NULL, NULL, NULL, NULL);
    lu_reset(&this);
    lu_save(&this, istore, xstore, BASICLU_OK);
}